

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void vera::sdf(Image *_image)

{
  float fVar1;
  undefined1 auVar2 [16];
  int iVar3;
  ostream *this;
  int *piVar4;
  ulong uVar5;
  float *f_00;
  undefined4 extraout_var;
  float *pfVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  int local_4c;
  int x_2;
  float *d_1;
  int local_38;
  int x_1;
  int y_2;
  int y_1;
  float *d;
  int y;
  int x;
  float *f;
  int height;
  int width;
  Image *_image_local;
  
  _height = _image;
  iVar3 = (*_image->_vptr_Image[8])();
  if (iVar3 < 2) {
    f._4_4_ = (*_height->_vptr_Image[6])();
    f._0_4_ = (*_height->_vptr_Image[7])();
    piVar4 = std::max<int>((int *)((long)&f + 4),(int *)&f);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)*piVar4;
    uVar5 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    f_00 = (float *)operator_new__(uVar5);
    __x = extraout_XMM0_Qa;
    for (d._4_4_ = 0; d._4_4_ < f._4_4_; d._4_4_ = d._4_4_ + 1) {
      for (d._0_4_ = 0; (int)d < (int)f; d._0_4_ = (int)d + 1) {
        iVar3 = (*_height->_vptr_Image[0xc])(_height,(ulong)(uint)((int)d * f._4_4_ + d._4_4_));
        f_00[(int)d] = *(float *)CONCAT44(extraout_var,iVar3);
      }
      pfVar6 = dt(f_00,(int)f);
      __x = extraout_XMM0_Qa_00;
      for (x_1 = 0; x_1 < (int)f; x_1 = x_1 + 1) {
        fVar1 = pfVar6[x_1];
        iVar3 = (*_height->_vptr_Image[0xc])(_height,(ulong)(uint)(x_1 * f._4_4_ + d._4_4_));
        __x = (double)(ulong)(uint)fVar1;
        *(float *)CONCAT44(extraout_var_00,iVar3) = fVar1;
      }
      if (pfVar6 != (float *)0x0) {
        operator_delete__(pfVar6);
        __x = extraout_XMM0_Qa_01;
      }
    }
    for (local_38 = 0; local_38 < (int)f; local_38 = local_38 + 1) {
      for (d_1._4_4_ = 0; d_1._4_4_ < f._4_4_; d_1._4_4_ = d_1._4_4_ + 1) {
        iVar3 = (*_height->_vptr_Image[0xc])(_height,(ulong)(uint)(local_38 * f._4_4_ + d_1._4_4_));
        f_00[d_1._4_4_] = *(float *)CONCAT44(extraout_var_01,iVar3);
      }
      pfVar6 = dt(f_00,f._4_4_);
      __x = extraout_XMM0_Qa_02;
      for (local_4c = 0; local_4c < f._4_4_; local_4c = local_4c + 1) {
        fVar1 = pfVar6[local_4c];
        iVar3 = (*_height->_vptr_Image[0xc])(_height,(ulong)(uint)(local_38 * f._4_4_ + local_4c));
        __x = (double)(ulong)(uint)fVar1;
        *(float *)CONCAT44(extraout_var_02,iVar3) = fVar1;
      }
      if (pfVar6 != (float *)0x0) {
        operator_delete__(pfVar6);
        __x = extraout_XMM0_Qa_03;
      }
    }
    sqrt(__x);
    autolevel(_height);
    if (f_00 != (float *)0x0) {
      operator_delete__(f_00);
    }
  }
  else {
    this = std::operator<<((ostream *)&std::cout,"We need a one channel image to compute an SDF");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void sdf(Image& _image) {
    if (_image.getChannels() > 1) {
        std::cout << "We need a one channel image to compute an SDF" << std::endl;
        return;
    }

    int width = _image.getWidth();
    int height = _image.getHeight();
    float *f = new float[std::max(width, height)];

    // transform along columns
    for (int x = 0; x < width; x++) {
        for (int y = 0; y < height; y++)
            f[y] = _image[y * width + x];
        
        float *d = dt(f, height);
        for (int y = 0; y < height; y++) 
            _image[y * width + x] = d[y];

        delete [] d;
    }

    // transform along rows
    for (int y = 0; y < height; y++) {
        for (int x = 0; x < width; x++)
            f[x] = _image[y * width + x];
        
        float *d = dt(f, width);
        for (int x = 0; x < width; x++)
            _image[y * width + x] = d[x];
            
        delete [] d;
    }

    sqrt(_image);
    autolevel(_image);

    delete [] f;
}